

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_utils.cc
# Opt level: O1

bool draco::parser::PeekWhitespace(DecoderBuffer *buffer,bool *end_reached)

{
  int iVar1;
  
  if (buffer->data_size_ < buffer->pos_ + 1) {
    *end_reached = true;
    return false;
  }
  iVar1 = isspace((uint)(byte)buffer->data_[buffer->pos_]);
  return iVar1 != 0;
}

Assistant:

bool PeekWhitespace(DecoderBuffer *buffer, bool *end_reached) {
  uint8_t c;
  if (!buffer->Peek(&c)) {
    *end_reached = true;
    return false;  // eof reached.
  }
  if (!isspace(c)) {
    return false;  // Non-whitespace character reached.
  }
  return true;
}